

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31cProgramInterfaceQueryTests.cpp
# Opt level: O1

long __thiscall glcts::anon_unknown_0::NullLength::Run(NullLength *this)

{
  CallLogWrapper *this_00;
  undefined8 src_vs;
  GLuint program;
  GLuint index;
  int iVar1;
  long lVar2;
  GLint res;
  string expected;
  GLenum prop;
  GLchar name [1024];
  
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x15])(name,this);
  src_vs = name._0_8_;
  (*(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
    [0x16])(&expected,this);
  program = PIQBase::CreateProgram((PIQBase *)this,(char *)src_vs,expected._M_dataplus._M_p,false);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected._M_dataplus._M_p != &expected.field_2) {
    operator_delete(expected._M_dataplus._M_p,expected.field_2._M_allocated_capacity + 1);
  }
  if ((GLchar *)name._0_8_ != name + 0x10) {
    operator_delete((void *)name._0_8_,name._16_8_ + 1);
  }
  this_00 = &(this->super_SimpleShaders).super_PIQBase.super_SubcaseBase.super_GLWrapper.
             super_CallLogWrapper;
  glu::CallLogWrapper::glBindAttribLocation(this_00,program,0,"position");
  PIQBase::LinkProgram((PIQBase *)this,program);
  memset(name,0,0x400);
  index = glu::CallLogWrapper::glGetProgramResourceIndex(this_00,program,0x92e4,"color");
  prop = 0x92fb;
  glu::CallLogWrapper::glGetProgramResourceName(this_00,program,0x92e4,0,0x400,(GLsizei *)0x0,name);
  glu::CallLogWrapper::glGetProgramResourceiv
            (this_00,program,0x92e4,index,1,&prop,1,(GLsizei *)0x0,&res);
  expected._M_dataplus._M_p = (pointer)&expected.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&expected,"color","");
  iVar1 = std::__cxx11::string::compare((char *)&expected);
  if (iVar1 == 0) {
    if (res == 1) {
      glu::CallLogWrapper::glDeleteProgram(this_00,program);
      lVar2 = 0;
      goto LAB_00c38f8c;
    }
    anon_unknown_0::Output("Expected array_size: 1, got: %d\n");
  }
  else {
    anon_unknown_0::Output("Expected name: %s, got: %s\n",expected._M_dataplus._M_p,name);
  }
  lVar2 = -1;
  glu::CallLogWrapper::glDeleteProgram(this_00,program);
LAB_00c38f8c:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)expected._M_dataplus._M_p != &expected.field_2) {
    operator_delete(expected._M_dataplus._M_p,expected.field_2._M_allocated_capacity + 1);
  }
  return lVar2;
}

Assistant:

virtual long Run()
	{
		GLuint program = CreateProgram(VertexShader().c_str(), FragmentShader().c_str(), false);
		glBindAttribLocation(program, 0, "position");
		LinkProgram(program);

		GLchar name[1024] = { '\0' };
		GLuint index	  = glGetProgramResourceIndex(program, GL_PROGRAM_OUTPUT, "color");
		GLenum prop		  = GL_ARRAY_SIZE;
		GLint  res;
		glGetProgramResourceName(program, GL_PROGRAM_OUTPUT, 0, 1024, NULL, name);
		glGetProgramResourceiv(program, GL_PROGRAM_OUTPUT, index, 1, &prop, 1, NULL, &res);

		std::string expected = "color";
		if (name != expected)
		{
			Output("Expected name: %s, got: %s\n", expected.c_str(), name);
			glDeleteProgram(program);
			return ERROR;
		}
		else if (res != 1)
		{
			Output("Expected array_size: 1, got: %d\n", res);
			glDeleteProgram(program);
			return ERROR;
		}

		glDeleteProgram(program);
		return NO_ERROR;
	}